

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_SpawnMissileZAimed
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double z;
  bool bVar1;
  AActor *pAVar2;
  int iVar3;
  char *pcVar4;
  AActor *dest;
  PClassActor *type;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_00434382;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00434360:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00434382:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x19ed,
                  "int AF_AActor_SpawnMissileZAimed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar2 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar2 == (AActor *)0x0) goto LAB_00434245;
    bVar1 = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00434382;
    }
  }
  else {
    if (pAVar2 != (AActor *)0x0) goto LAB_00434360;
LAB_00434245:
    pAVar2 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
LAB_004343aa:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x19ee,
                  "int AF_AActor_SpawnMissileZAimed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    pcVar4 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_004343aa;
  }
  if ((uint)numparam < 3) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_004343c9;
  }
  if (param[2].field_0.field_3.Type != '\x03') {
LAB_00434369:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_004343c9;
  }
  z = param[1].field_0.f;
  dest = (AActor *)param[2].field_0.field_1.a;
  if (param[2].field_0.field_1.atag == 1) {
    if (dest == (AActor *)0x0) goto LAB_00434298;
LAB_004342ad:
    bVar1 = DObject::IsKindOf((DObject *)dest,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar4 = "dest == NULL || dest->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_004343c9:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x19ef,
                    "int AF_AActor_SpawnMissileZAimed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (dest != (AActor *)0x0) goto LAB_00434369;
LAB_00434298:
    NullParam("\"dest\"");
    dest = (AActor *)param[2].field_0.field_1.a;
    if (dest != (AActor *)0x0) goto LAB_004342ad;
    dest = (AActor *)0x0;
  }
  if (numparam == 3) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_004343e8;
  }
  if (param[3].field_0.field_3.Type != '\x03') {
LAB_00434372:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004343e8:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x19f0,
                  "int AF_AActor_SpawnMissileZAimed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[3].field_0.field_1.a;
  if (param[3].field_0.field_1.atag == 1) {
    if (type != (PClassActor *)0x0) {
      bVar1 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
      if (!bVar1) {
        pcVar4 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_004343e8;
      }
      goto LAB_0043431b;
    }
  }
  else if (type != (PClassActor *)0x0) goto LAB_00434372;
  type = (PClassActor *)0x0;
LAB_0043431b:
  pAVar2 = P_SpawnMissileZAimed(pAVar2,z,dest,type);
  if (numret < 1) {
    iVar3 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x19f1,
                    "int AF_AActor_SpawnMissileZAimed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar3 = 1;
    VMReturn::SetPointer(ret,pAVar2,1);
  }
  return iVar3;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnMissileZAimed)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(z);
	PARAM_OBJECT_NOT_NULL(dest, AActor);
	PARAM_CLASS(type, AActor);
	ACTION_RETURN_OBJECT(P_SpawnMissileZAimed(self, z, dest, type));
}